

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_stack_test.cpp
# Opt level: O0

void __thiscall value_stack_test_single_type_Test::TestBody(value_stack_test_single_type_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_68;
  Message local_60;
  int local_58 [2];
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  int local_2c;
  undefined1 local_28 [8];
  stack s;
  value_stack_test_single_type_Test *this_local;
  
  s.m_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  mvm::value_stack<mvm::list::mplist<int>_>::value_stack
            ((value_stack<mvm::list::mplist<int>_> *)local_28);
  local_2c = 1;
  mvm::value_stack<mvm::list::mplist<int>_>::push<int>
            ((value_stack<mvm::list::mplist<int>_> *)local_28,&local_2c);
  local_58[1] = 1;
  local_58[0] = mvm::value_stack<mvm::list::mplist<int>_>::pop<int>
                          ((value_stack<mvm::list::mplist<int>_> *)local_28);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_50,"1","s.template pop<int>()",local_58 + 1,local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kenavolic[P]mvm/tests/value_stack_test.cpp"
               ,0x1d,message);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message(&local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  mvm::value_stack<mvm::list::mplist<int>_>::~value_stack
            ((value_stack<mvm::list::mplist<int>_> *)local_28);
  return;
}

Assistant:

TEST(value_stack_test, single_type) {
  using stack = value_stack<mplist<int>>;

  stack s;
  s.push(1);

  EXPECT_EQ(1, s.template pop<int>());
}